

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall
libtorrent::tracker_warning_alert::~tracker_warning_alert(tracker_warning_alert *this)

{
  tracker_warning_alert *this_local;
  
  ~tracker_warning_alert(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

struct TORRENT_EXPORT tracker_warning_alert final : tracker_alert
	{
		// internal
		TORRENT_UNEXPORT tracker_warning_alert(aux::stack_allocator& alloc
			, torrent_handle const& h, tcp::endpoint const& ep
			, string_view u, protocol_version v, string_view m);

		TORRENT_DEFINE_ALERT(tracker_warning_alert, 12)

		static inline constexpr alert_category_t static_category = alert_category::tracker | alert_category::error;
		std::string message() const override;

		// the message associated with this warning
		char const* warning_message() const;

	private:
		aux::allocation_slot m_msg_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		// contains the warning message from the tracker.
		TORRENT_DEPRECATED std::string msg;
#endif
	}